

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O0

bool __thiscall draco::ObjEncoder::EncodeInternal(ObjEncoder *this)

{
  bool bVar1;
  undefined8 *in_RDI;
  ObjEncoder *in_stack_00000018;
  ObjEncoder *in_stack_00000088;
  ObjEncoder *in_stack_000000b8;
  ObjEncoder *in_stack_00000198;
  bool local_1;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  *(undefined4 *)(in_RDI + 0x13) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x1b) = 0xffffffff;
  bVar1 = GetSubObjects(in_stack_000000b8);
  if (bVar1) {
    if ((in_RDI[0xb] != 0) && (bVar1 = GetAddedEdges(in_stack_00000088), !bVar1)) {
      return false;
    }
    bVar1 = EncodeMaterialFileName(in_stack_00000198);
    if (bVar1) {
      bVar1 = EncodePositions(in_stack_00000018);
      if (bVar1) {
        bVar1 = EncodeTextureCoordinates(in_stack_00000018);
        if (bVar1) {
          bVar1 = EncodeNormals(in_stack_00000018);
          if (bVar1) {
            if ((in_RDI[0xb] != 0) && (bVar1 = EncodeFaces(this), !bVar1)) {
              return false;
            }
            local_1 = true;
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ObjEncoder::EncodeInternal() {
  pos_att_ = nullptr;
  tex_coord_att_ = nullptr;
  normal_att_ = nullptr;
  material_att_ = nullptr;
  sub_obj_att_ = nullptr;
  added_edges_att_ = nullptr;
  current_sub_obj_id_ = -1;
  current_material_id_ = -1;
  if (!GetSubObjects()) {
    return false;
  }
  if (in_mesh_ && !GetAddedEdges()) {
    return false;
  }
  if (!EncodeMaterialFileName()) {
    return false;
  }
  if (!EncodePositions()) {
    return false;
  }
  if (!EncodeTextureCoordinates()) {
    return false;
  }
  if (!EncodeNormals()) {
    return false;
  }
  if (in_mesh_ && !EncodeFaces()) {
    return false;
  }
  return true;
}